

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void BoostLexicalCastOnStack(void)

{
  long lVar1;
  ostream *poVar2;
  int *arg;
  int iVar3;
  bool bVar4;
  undefined1 local_1420 [8];
  random_device _rdev;
  buf_t buf;
  uniform_int_distribution<int> _dist;
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  result_type i;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"boost::lexical_cast on stack");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  std::random_device::random_device((random_device *)local_1420);
  buf._M_elems[0x38] = '\0';
  buf._M_elems[0x39] = '\0';
  buf._M_elems[0x3a] = '\0';
  buf._M_elems[0x3b] = -0x80;
  buf._M_elems[0x3c] = -1;
  buf._M_elems[0x3d] = -1;
  buf._M_elems[0x3e] = -1;
  buf._M_elems[0x3f] = '\x7f';
  _result.__r = (rep)&_dist;
  _prof.mResult = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::steady_clock::now();
  iVar3 = 10000000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    _prof.mStart.__d.__r._4_4_ =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)(buf._M_elems + 0x38),
                    (random_device *)local_1420);
    boost::lexical_cast<std::array<char,64ul>,int>
              ((array<char,_64UL> *)((long)&_rdev.field_0 + 0x1380),
               (boost *)((long)&_prof.mStart.__d.__r + 4),arg);
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  std::random_device::~random_device((random_device *)local_1420);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)_dist._M_param);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void BoostLexicalCastOnStack()
{
    typedef std::array<char, 64> buf_t;
    RANDOM_PROFILING_BEGIN("boost::lexical_cast on stack")
    buf_t buf = boost::lexical_cast<buf_t>(i);
    RANDOM_PROFILING_END()
}